

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::clearEkkDataInfo(HEkk *this)

{
  SimplexBasis *this_00;
  long in_RDI;
  HighsSimplexInfo *info;
  
  this_00 = (SimplexBasis *)(in_RDI + 0x2560);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x7679d3);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x7679e1);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x7679ef);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x7679fd);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767a0b);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767a19);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767a2a);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767a3b);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767a4c);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767a5d);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767a6e);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767a7f);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767a90);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x767aa1);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x767ab2);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x767ac3);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767ad4);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x767ae5);
  *(undefined4 *)&this_00[3].hash = 0;
  *(undefined4 *)((long)&this_00[3].hash + 4) = 0;
  *(undefined1 *)&this_00[3].debug_id = 0;
  *(undefined1 *)((long)&this_00[3].debug_id + 1) = 0;
  SimplexBasis::clear(this_00);
  *(undefined4 *)&this_00[4].debug_origin_name = 0;
  *(undefined4 *)&this_00[4].debug_origin_name.field_0x4 = 0;
  *(undefined4 *)&this_00[4].debug_origin_name._M_string_length = 0;
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767b6a);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767b7b);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767b8c);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x767b9d);
  this_00[5].debug_id = 0;
  this_00[5].debug_update_count = 0;
  *(undefined4 *)&this_00[5].debug_origin_name = 0;
  *(undefined4 *)&this_00[5].debug_origin_name.field_0x4 = 0;
  this_00[5].debug_origin_name._M_string_length = 0x3ff0000000000000;
  this_00[5].debug_origin_name.field_2._M_allocated_capacity = 0x3ff0000000000000;
  *(undefined8 *)((long)&this_00[5].debug_origin_name.field_2 + 8) = 0x3ff0000000000000;
  *(undefined1 *)&this_00[6].debug_origin_name._M_string_length = 0;
  this_00[6].debug_origin_name.field_2._M_allocated_capacity = 0;
  *(undefined1 *)
   &this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 3) = 0;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 6) = 0;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 7) = 0;
  *(undefined1 *)
   &this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 1;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 1;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 3) = 1;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  *(undefined1 *)
   ((long)&this_00[7].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 6) = 0;
  *(undefined4 *)
   &this_00[7].nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = 0xffffffff;
  this_00[7].nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x7ff0000000000000;
  this_00[7].nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x7ff0000000000000;
  *(undefined4 *)&this_00[7].hash = 0xffffffff;
  this_00[7].debug_id = 0;
  this_00[7].debug_update_count = 0x7ff00000;
  *(undefined8 *)&this_00[7].debug_origin_name = 0x7ff0000000000000;
  *(undefined4 *)&this_00[7].debug_origin_name._M_string_length = 0;
  *(undefined4 *)((long)&this_00[7].debug_origin_name._M_string_length + 4) = 0;
  *(undefined4 *)&this_00[7].debug_origin_name.field_2 = 0;
  *(undefined4 *)((long)&this_00[7].debug_origin_name.field_2 + 4) = 0;
  *(undefined4 *)((long)&this_00[7].debug_origin_name.field_2 + 8) = 0;
  *(undefined4 *)
   ((long)&this_00[8].basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 1;
  *(undefined4 *)
   &this_00[8].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start = 1;
  *(undefined4 *)
   ((long)&this_00[8].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 8;
  *(undefined4 *)
   &this_00[8].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  *(undefined4 *)
   ((long)&this_00[8].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  this_00[8].nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[8].nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this_00[8].nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00[8].nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&this_00[8].hash = 0;
  return;
}

Assistant:

void HEkk::clearEkkDataInfo() {
  HighsSimplexInfo& info = this->info_;
  info.workCost_.clear();
  info.workDual_.clear();
  info.workShift_.clear();
  info.workLower_.clear();
  info.workUpper_.clear();
  info.workRange_.clear();
  info.workValue_.clear();
  info.workLowerShift_.clear();
  info.workUpperShift_.clear();
  info.baseLower_.clear();
  info.baseUpper_.clear();
  info.baseValue_.clear();
  info.numTotRandomValue_.clear();
  info.numTotPermutation_.clear();
  info.numColPermutation_.clear();
  info.devex_index_.clear();
  info.pivot_.clear();
  info.index_chosen_.clear();
  info.phase1_backtracking_test_done = false;
  info.phase2_backtracking_test_done = false;
  info.backtracking_ = false;
  info.valid_backtracking_basis_ = false;
  info.backtracking_basis_.clear();
  info.backtracking_basis_costs_shifted_ = false;
  info.backtracking_basis_costs_perturbed_ = false;
  info.backtracking_basis_bounds_perturbed_ = false;
  info.backtracking_basis_workShift_.clear();
  info.backtracking_basis_workLowerShift_.clear();
  info.backtracking_basis_workUpperShift_.clear();
  info.backtracking_basis_edge_weight_.clear();
  info.simplex_strategy = 0;
  info.dual_edge_weight_strategy = 0;
  info.primal_edge_weight_strategy = 0;
  info.price_strategy = 0;
  info.dual_simplex_cost_perturbation_multiplier = 1;
  info.primal_simplex_phase1_cost_perturbation_multiplier = 1;
  info.primal_simplex_bound_perturbation_multiplier = 1;
  info.allow_dual_steepest_edge_to_devex_switch = 0;
  info.dual_steepest_edge_weight_log_error_threshold = 0;
  info.run_quiet = false;
  info.store_squared_primal_infeasibility = false;
  info.report_simplex_inner_clock = false;
  info.report_simplex_outer_clock = false;
  info.report_simplex_phases_clock = false;
  info.report_HFactor_clock = false;
  info.analyse_lp = false;
  info.analyse_iterations = false;
  info.analyse_invert_form = false;

  info.allow_cost_shifting = true;
  info.allow_cost_perturbation = true;
  info.allow_bound_perturbation = true;
  info.costs_shifted = false;
  info.costs_perturbed = false;
  info.bounds_perturbed = false;

  info.num_primal_infeasibilities = kHighsIllegalInfeasibilityCount;
  info.max_primal_infeasibility = kHighsIllegalInfeasibilityMeasure;
  info.sum_primal_infeasibilities = kHighsIllegalInfeasibilityMeasure;
  info.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
  info.max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
  info.sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;
  info.dual_phase1_iteration_count = 0;
  info.dual_phase2_iteration_count = 0;
  info.primal_phase1_iteration_count = 0;
  info.primal_phase2_iteration_count = 0;
  info.primal_bound_swap = 0;
  info.min_concurrency = 1;
  info.num_concurrency = 1;
  info.max_concurrency = kSimplexConcurrencyLimit;
  info.multi_iteration = 0;
  info.update_count = 0;
  info.dual_objective_value = 0;
  info.primal_objective_value = 0;
  info.updated_dual_objective_value = 0;
  info.updated_primal_objective_value = 0;
  info.num_basic_logicals = 0;
}